

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

void __thiscall vec<signed_char>::growTo(vec<signed_char> *this,uint size,char *pad)

{
  undefined1 *in_RDX;
  uint in_ESI;
  uint *in_RDI;
  uint i;
  uint local_1c;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*in_RDI < in_ESI) {
    reserve((vec<signed_char> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
            (uint)((ulong)in_RDX >> 0x20));
    for (local_1c = *in_RDI; local_1c < in_ESI; local_1c = local_1c + 1) {
      *(undefined1 *)(*(long *)(in_RDI + 2) + (ulong)local_1c) = *in_RDX;
    }
    *in_RDI = in_ESI;
  }
  return;
}

Assistant:

void growTo(unsigned int size, const T& pad) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T(pad);
		}
		sz = size;
	}